

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

uv_handle_type uv__handle_type(int fd)

{
  int iVar1;
  int local_9c [2];
  int type;
  socklen_t len;
  socklen_t sslen;
  sockaddr_storage ss;
  int fd_local;
  
  ss.__ss_align._0_4_ = fd;
  memset(&len,0,0x80);
  type = 0x80;
  iVar1 = getsockname((int)ss.__ss_align,(sockaddr *)&len,(socklen_t *)&type);
  if (iVar1 == 0) {
    local_9c[1] = 4;
    iVar1 = getsockopt((int)ss.__ss_align,1,3,local_9c,(socklen_t *)(local_9c + 1));
    if (iVar1 == 0) {
      if (local_9c[0] == 1) {
        if ((short)len == 1) {
          return UV_NAMED_PIPE;
        }
        if (((short)len == 2) || ((short)len == 10)) {
          return UV_TCP;
        }
      }
      if ((local_9c[0] == 2) && (((short)len == 2 || ((short)len == 10)))) {
        ss.__ss_align._4_4_ = UV_UDP;
      }
      else {
        ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
      }
    }
    else {
      ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
    }
  }
  else {
    ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
  }
  return ss.__ss_align._4_4_;
}

Assistant:

uv_handle_type uv__handle_type(int fd) {
  struct sockaddr_storage ss;
  socklen_t sslen;
  socklen_t len;
  int type;

  memset(&ss, 0, sizeof(ss));
  sslen = sizeof(ss);

  if (getsockname(fd, (struct sockaddr*)&ss, &sslen))
    return UV_UNKNOWN_HANDLE;

  len = sizeof type;

  if (getsockopt(fd, SOL_SOCKET, SO_TYPE, &type, &len))
    return UV_UNKNOWN_HANDLE;

  if (type == SOCK_STREAM) {
#if defined(_AIX) || defined(__DragonFly__)
    /* on AIX/DragonFly the getsockname call returns an empty sa structure
     * for sockets of type AF_UNIX.  For all other types it will
     * return a properly filled in structure.
     */
    if (sslen == 0)
      return UV_NAMED_PIPE;
#endif
    switch (ss.ss_family) {
      case AF_UNIX:
        return UV_NAMED_PIPE;
      case AF_INET:
      case AF_INET6:
        return UV_TCP;
      }
  }

  if (type == SOCK_DGRAM &&
      (ss.ss_family == AF_INET || ss.ss_family == AF_INET6))
    return UV_UDP;

  return UV_UNKNOWN_HANDLE;
}